

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O1

char * Extra_UtilTildeExpand(char *fname)

{
  size_t sVar1;
  char *pcVar2;
  
  if (fname != (char *)0x0) {
    sVar1 = strlen(fname);
    pcVar2 = (char *)malloc(sVar1 + 1);
    pcVar2 = strcpy(pcVar2,fname);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char * Extra_UtilTildeExpand( char *fname )
{
    return Extra_UtilStrsav( fname );
/*
    int         n_tildes = 0;
    const char* home;
    char*       expanded;
    int         length;
    int         i, j, k;

    for (i = 0; i < (int)strlen(fname); i++)
        if (fname[i] == '~') n_tildes++;

    home     = getenv("HOME");
    length   = n_tildes * strlen(home) + strlen(fname);
    expanded = ABC_ALLOC(char, length + 1);

    j = 0;
    for (i = 0; i < (int)strlen(fname); i++){
        if (fname[i] == '~'){
            for (k = 0; k < (int)strlen(home); k++)
                expanded[j++] = home[k];
        }else
            expanded[j++] = fname[i];
    }

    expanded[j] = '\0';
    return expanded; 
*/
}